

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Initialize(BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *this,int capacity)

{
  int iVar1;
  code *pcVar2;
  Type TVar3;
  int *piVar4;
  bool bVar5;
  undefined4 *puVar6;
  DictionaryStats *pDVar7;
  int size;
  uint bucketCount;
  Type local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  bucketCount = 4;
  size = 4;
  if (4 < capacity) {
    size = capacity;
  }
  if ((8 < capacity) && (bucketCount = size + 1U >> 1, (bucketCount - 1 & bucketCount) != 0)) {
    iVar1 = 0x1f;
    if (bucketCount != 0) {
      for (; bucketCount >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    bucketCount = 1 << (-((byte)iVar1 ^ 0x1f) & 0x1f);
  }
  local_40.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  Allocate(this,&local_40.ptr,(EntryType **)&newBuckets,bucketCount,size);
  TVar3.ptr = local_40.ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->buckets).ptr = TVar3.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  piVar4 = newBuckets;
  Memory::Recycler::WBSetBit((char *)&this->entries);
  (this->entries).ptr =
       (SimpleDictionaryEntry<int,_Memory::WriteBarrierPtr<Js::PropertyGuard>_> *)piVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
  this->bucketCount = bucketCount;
  this->size = size;
  this->modFunctionIndex = 0x4b;
  if (this->freeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x38c,"(this->freeCount == 0)","this->freeCount == 0");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pDVar7 = DictionaryStats::Create
                     ("PN6JsUtil14BaseDictionaryIiPN2Js13PropertyGuardEN6Memory8RecyclerE20DictionarySizePolicyI14PowerOf2PolicyLj2ELj2ELj1ELj4EE15DefaultComparerNS_21SimpleDictionaryEntryENS_12NoResizeLockEEE"
                      ,this->size);
  this->stats = pDVar7;
  return;
}

Assistant:

void Initialize(int capacity)
        {
            // minimum capacity is 4
            int initSize = max(capacity, 4);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint initBucketCount = SizePolicy::GetBucketSize(initSize, &modIndex);
            AssertMsg(initBucketCount > 0, "Size returned by policy should be greater than 0");

            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            Allocate(&newBuckets, &newEntries, initBucketCount, initSize);

            // Allocation can throw - assign only after allocation has succeeded.
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->bucketCount = initBucketCount;
            this->size = initSize;
            this->modFunctionIndex = modIndex;
            Assert(this->freeCount == 0);
#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }